

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_graph.cc
# Opt level: O0

void anon_unknown.dwarf_e922f::sanity_check_name(string_view name,char *explanation)

{
  const_iterator pvVar1;
  const_iterator pvVar2;
  difference_type dVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  this;
  GraphFileError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  string safe_name;
  string *in_stack_fffffffffffffe78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  local_18 = in_RDX;
  pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::begin(&local_10);
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::end(&local_10);
  dVar3 = std::
          count_if<char_const*,(anonymous_namespace)::sanity_check_name(std::basic_string_view<char,std::char_traits<char>>,char_const*)::__0>
                    (pvVar1,pvVar2);
  if (dVar3 != 0) {
    __rhs = &local_40;
    std::__cxx11::string::string(in_stack_fffffffffffffe90);
    pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::begin(&local_10);
    __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::basic_string_view<char,_std::char_traits<char>_>::end(&local_10);
    this = std::back_inserter<std::__cxx11::string>(in_stack_fffffffffffffe78);
    std::
    transform<char_const*,std::back_insert_iterator<std::__cxx11::string>,(anonymous_namespace)::sanity_check_name(std::basic_string_view<char,std::char_traits<char>>,char_const*)::__1>
              (pvVar1,__str,this.container);
    this_00 = (GraphFileError *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this.container,(char *)__str,(allocator<char> *)__rhs);
    std::operator+((char *)local_18,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    std::operator+(local_18,(char *)this_00);
    std::__cxx11::string::string(this.container,__str);
    std::operator+(__str,__rhs);
    std::operator+(local_18,(char *)this_00);
    GraphFileError::GraphFileError(this_00,in_stack_fffffffffffffe78);
    __cxa_throw(this_00,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
  }
  return;
}

Assistant:

auto sanity_check_name(string_view name, const char * const explanation) -> void
    {
        if (0 != count_if(name.begin(), name.end(), [](unsigned char c) { return ! isgraph(c); })) {
            string safe_name;
            transform(name.begin(), name.end(), back_inserter(safe_name), [](unsigned char c) { return isgraph(c) ? c : '?'; });
            throw GraphFileError("Suspicious input detected: " + string(explanation) + " '" + string(safe_name) + "' contains non-printable characters");
        }
    }